

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_rule.c
# Opt level: O3

feed_db_status_t store_fare_rule_db(fare_rule_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  sqlite3_stmt *stmt;
  char qr [112];
  sqlite3_stmt *local_a0;
  char local_98 [120];
  
  pcVar2 = 
  "INSERT INTO fare_rules (fare_id, route_id, origin_id, destination_id, contains_id) values (?1, ?2, ?3, ?4, ?5);"
  ;
  pcVar4 = local_98;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pcVar4 = *(undefined8 *)pcVar2;
    pcVar2 = pcVar2 + 8;
    pcVar4 = pcVar4 + 8;
  }
  sqlite3_prepare_v2(db->conn,local_98,-1,&local_a0,(char **)0x0);
  sqlite3_bind_text(local_a0,1,record->fare_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_a0,2,record->route_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_a0,3,record->origin_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_a0,4,record->destination_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_a0,5,record->contains_id,-1,(_func_void_void_ptr *)0x0);
  iVar1 = sqlite3_step(local_a0);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(local_a0);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_fare_rule_db(fare_rule_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO fare_rules ("
                    "fare_id, route_id, origin_id, destination_id, contains_id"
                ") values ("
                    "?1, ?2, ?3, ?4, ?5"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->fare_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->route_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->origin_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 4, record->destination_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 5, record->contains_id, -1, SQLITE_STATIC);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}